

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O2

void __thiscall
pstd::optional<pbrt::Bounds2<int>_>::optional
          (optional<pbrt::Bounds2<int>_> *this,optional<pbrt::Bounds2<int>_> *v)

{
  bool bVar1;
  Tuple2<pbrt::Point2,_int> TVar2;
  Bounds2<int> *pBVar3;
  
  bVar1 = v->set;
  this->set = bVar1;
  if (bVar1 == true) {
    pBVar3 = value(v);
    TVar2 = (pBVar3->pMax).super_Tuple2<pbrt::Point2,_int>;
    *(Tuple2<pbrt::Point2,_int> *)&this->optionalValue =
         (pBVar3->pMin).super_Tuple2<pbrt::Point2,_int>;
    *(Tuple2<pbrt::Point2,_int> *)((long)&this->optionalValue + 8) = TVar2;
    reset(v);
    return;
  }
  return;
}

Assistant:

PBRT_CPU_GPU
    bool has_value() const { return set; }